

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatus.cxx
# Opt level: O3

int testStatus(int param_1,char **param_2)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  Status local_40;
  string local_38;
  
  local_40.Kind_ = Success;
  local_40.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
  cmsys::Status::GetString_abi_cxx11_(&local_38,&local_40);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Status Success kind does not return \"Success\" string\n",0x35
              );
  }
  local_40.Kind_ = POSIX;
  local_40.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x16;
  cmsys::Status::GetString_abi_cxx11_(&local_38,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_38._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Status POSIX kind returns empty string\n",0x27);
  }
  piVar2 = __errno_location();
  *piVar2 = 2;
  local_40 = cmsys::Status::POSIX_errno();
  bVar3 = local_40 != (Status)0x200000001;
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Status POSIX_errno did not use errno\n",0x25);
  }
  *piVar2 = 0;
  return (int)(bVar3 || (local_38._M_string_length == 0 || iVar1 != 0));
}

Assistant:

int testStatus(int, char* [])
{
  bool res = true;
  {
    kwsys::Status status;
    if (status.GetKind() != kwsys::Status::Kind::Success) {
      std::cerr << "Status default constructor does not produce Success\n";
      res = false;
    }

    status = kwsys::Status::Success();
    if (status.GetKind() != kwsys::Status::Kind::Success) {
      std::cerr << "Status Success constructor does not produce Success\n";
      res = false;
    }
    if (!status.IsSuccess()) {
      std::cerr << "Status Success gives false IsSuccess\n";
      res = false;
    }
    if (!status) {
      std::cerr << "Status Success kind is not true\n";
      res = false;
    }
    if (status.GetPOSIX() != 0) {
      std::cerr << "Status Success kind does not return POSIX 0\n";
      res = false;
    }
#ifdef _WIN32
    if (status.GetWindows() != 0) {
      std::cerr << "Status Success kind does not return Windows 0\n";
      res = false;
    }
#endif
    if (status.GetString() != "Success") {
      std::cerr << "Status Success kind does not return \"Success\" string\n";
      res = false;
    }

    status = kwsys::Status::POSIX(EINVAL);
    if (status.GetKind() != kwsys::Status::Kind::POSIX) {
      std::cerr << "Status POSIX constructor does not produce POSIX\n";
      res = false;
    }
    if (status.IsSuccess()) {
      std::cerr << "Status POSIX gives true IsSuccess\n";
      res = false;
    }
    if (status) {
      std::cerr << "Status POSIX kind is not false\n";
      res = false;
    }
    if (status.GetPOSIX() != EINVAL) {
      std::cerr << "Status POSIX kind does not preserve POSIX value\n";
      res = false;
    }
#ifdef _WIN32
    if (status.GetWindows() != 0) {
      std::cerr << "Status POSIX kind does not return Windows 0\n";
      res = false;
    }
#endif
    if (status.GetString().empty()) {
      std::cerr << "Status POSIX kind returns empty string\n";
      res = false;
    }
    errno = ENOENT;
    status = kwsys::Status::POSIX_errno();
    if (status.GetPOSIX() != ENOENT) {
      std::cerr << "Status POSIX_errno did not use errno\n";
      res = false;
    }
    errno = 0;

#ifdef _WIN32
    status = kwsys::Status::Windows(ERROR_INVALID_PARAMETER);
    if (status.GetKind() != kwsys::Status::Kind::Windows) {
      std::cerr << "Status Windows constructor does not produce Windows\n";
      res = false;
    }
    if (status.IsSuccess()) {
      std::cerr << "Status Windows gives true IsSuccess\n";
      res = false;
    }
    if (status) {
      std::cerr << "Status Windows kind is not false\n";
      res = false;
    }
    if (status.GetWindows() != ERROR_INVALID_PARAMETER) {
      std::cerr << "Status Windows kind does not preserve Windows value\n";
      res = false;
    }
    if (status.GetPOSIX() != 0) {
      std::cerr << "Status Windows kind does not return POSIX 0\n";
      res = false;
    }
    if (status.GetString().empty()) {
      std::cerr << "Status Windows kind returns empty string\n";
      res = false;
    }

    SetLastError(ERROR_FILE_NOT_FOUND);
    status = kwsys::Status::Windows_GetLastError();
    if (status.GetWindows() != ERROR_FILE_NOT_FOUND) {
      std::cerr << "Status Windows_GetLastError did not use GetLastError()\n";
      res = false;
    }
    SetLastError(ERROR_SUCCESS);
#endif
  }
  return res ? 0 : 1;
}